

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[20],unsigned_long,char[3],unsigned_long,char[39],unsigned_long,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [20],unsigned_long *Args_1,
          char (*Args_2) [3],unsigned_long *Args_3,char (*Args_4) [39],unsigned_long *Args_5,
          char (*Args_6) [3])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [39];
  unsigned_long *Args_local_3;
  char (*Args_local_2) [3];
  unsigned_long *Args_local_1;
  char (*Args_local) [20];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[20],unsigned_long,char[3],unsigned_long,char[39],unsigned_long,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [20])this,(unsigned_long *)Args,(char (*) [3])Args_1,(unsigned_long *)Args_2,
             (char (*) [39])Args_3,(unsigned_long *)Args_4,(char (*) [3])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}